

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

void __thiscall
icu_63::MessagePatternList<double,_8>::copyFrom
          (MessagePatternList<double,_8> *this,MessagePatternList<double,_8> *other,int32_t length,
          UErrorCode *errorCode)

{
  double *__dest;
  size_t s;
  
  if ((0 < length) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((this->a).capacity < length) {
      s = (ulong)(uint)length << 3;
      __dest = (double *)uprv_malloc_63(s);
      if (__dest == (double *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      if ((this->a).needToRelease != '\0') {
        uprv_free_63((this->a).ptr);
      }
      (this->a).ptr = __dest;
      (this->a).capacity = length;
      (this->a).needToRelease = '\x01';
    }
    else {
      __dest = (this->a).ptr;
      s = (ulong)(uint)length << 3;
    }
    memcpy(__dest,(other->a).ptr,s);
    return;
  }
  return;
}

Assistant:

void
MessagePatternList<T, stackCapacity>::copyFrom(
        const MessagePatternList<T, stackCapacity> &other,
        int32_t length,
        UErrorCode &errorCode) {
    if(U_SUCCESS(errorCode) && length>0) {
        if(length>a.getCapacity() && NULL==a.resize(length)) {
            errorCode=U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        uprv_memcpy(a.getAlias(), other.a.getAlias(), (size_t)length*sizeof(T));
    }
}